

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.h
# Opt level: O1

void __thiscall SQLite::Statement::checkIndex(Statement *this,int aIndex)

{
  Exception *this_00;
  
  if ((-1 < aIndex) && (aIndex < this->mColumnCount)) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,"Column index out of range.");
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void checkIndex(const int aIndex) const
    {
        if ((aIndex < 0) || (aIndex >= mColumnCount))
        {
            throw SQLite::Exception("Column index out of range.");
        }
    }